

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileUplink(jx9_gen_state *pGen)

{
  sxi32 sVar1;
  bool bVar2;
  int local_2c;
  sxi32 rc;
  sxi32 nExpr;
  SyToken *pNext;
  SyToken *pTmp;
  jx9_gen_state *pGen_local;
  
  _rc = (SyToken *)0x0;
  pGen->pIn = pGen->pIn + 1;
  if ((pGen->pIn < pGen->pEnd) && ((pGen->pIn->nType & 0x40000) == 0)) {
    pNext = pGen->pEnd;
    local_2c = 0;
    pTmp = (SyToken *)pGen;
    while (sVar1 = jx9GetNextExpr((SyToken *)pTmp[10].pUserData,pNext,(SyToken **)&rc), sVar1 == 0)
    {
      if ((SyToken *)pTmp[10].pUserData < _rc) {
        pTmp[0xb].sData.zString = (char *)_rc;
        if ((*(uint *)((long)pTmp[10].pUserData + 0x10) & 0x10) == 0) {
          sVar1 = jx9GenCompileError((jx9_gen_state *)pTmp,1,
                                     *(sxu32 *)((long)pTmp[10].pUserData + 0x14),
                                     "uplink: Expected variable name");
          if (sVar1 == -10) {
            return -10;
          }
        }
        else {
          pTmp[10].pUserData = (void *)((long)pTmp[10].pUserData + 0x20);
          if (pTmp[10].pUserData < pTmp[0xb].sData.zString) {
            sVar1 = jx9CompileExpr((jx9_gen_state *)pTmp,0,
                                   (_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
            if (sVar1 == -10) {
              return -10;
            }
            if (sVar1 != -3) {
              local_2c = local_2c + 1;
            }
          }
          else {
            jx9GenCompileError((jx9_gen_state *)pTmp,2,*(sxu32 *)((long)pTmp[10].pUserData + -0xc),
                               "uplink: Empty variable name");
          }
        }
      }
      pTmp[10].pUserData = _rc;
      while( true ) {
        bVar2 = false;
        if ((SyToken *)pTmp[10].pUserData < pNext) {
          bVar2 = (*(uint *)((long)pTmp[10].pUserData + 0x10) & 0x20000) != 0;
        }
        if (!bVar2) break;
        pTmp[10].pUserData = (void *)((long)pTmp[10].pUserData + 0x20);
      }
    }
    pTmp[0xb].sData.zString = (char *)pNext;
    if (0 < local_2c) {
      jx9VmEmitInstr((jx9_vm *)(pTmp->sData).zString,0x40,local_2c,0,(void *)0x0,(sxu32 *)0x0);
    }
  }
  return 0;
}

Assistant:

static sxi32 jx9CompileUplink(jx9_gen_state *pGen)
{
	SyToken *pTmp, *pNext = 0;
	sxi32 nExpr;
	sxi32 rc;
	/* Jump the 'uplink' keyword */
	pGen->pIn++;
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_SEMI) ){
		/* Nothing to process */
		return SXRET_OK;
	}
	pTmp = pGen->pEnd;
	nExpr = 0;
	while( SXRET_OK == jx9GetNextExpr(pGen->pIn, pTmp, &pNext) ){
		if( pGen->pIn < pNext ){
			pGen->pEnd = pNext;
			if( (pGen->pIn->nType & JX9_TK_DOLLAR) == 0 ){
				rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "uplink: Expected variable name");
				if( rc == SXERR_ABORT ){
					return SXERR_ABORT;
				}
			}else{
				pGen->pIn++;
				if( pGen->pIn >= pGen->pEnd ){
					/* Emit a warning */
					jx9GenCompileError(&(*pGen), E_WARNING, pGen->pIn[-1].nLine, "uplink: Empty variable name");
				}else{
					rc = jx9CompileExpr(&(*pGen), 0, 0);
					if( rc == SXERR_ABORT ){
						return SXERR_ABORT;
					}else if(rc != SXERR_EMPTY ){
						nExpr++;
					}
				}
			}
		}
		/* Next expression in the stream */
		pGen->pIn = pNext;
		/* Jump trailing commas */
		while( pGen->pIn < pTmp && (pGen->pIn->nType & JX9_TK_COMMA) ){
			pGen->pIn++;
		}
	}
	/* Restore token stream */
	pGen->pEnd = pTmp;
	if( nExpr > 0 ){
		/* Emit the uplink instruction */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_UPLINK, nExpr, 0, 0, 0);
	}
	return SXRET_OK;
}